

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

bool __thiscall SQGenerator::Resume(SQGenerator *this,SQVM *v,SQObjectPtr *dest)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQObjectType SVar3;
  SQObjectType SVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  SQUnsignedInteger SVar8;
  CallInfo *pCVar9;
  SQTable *pSVar10;
  SQExceptionTrap *pSVar11;
  ulong uVar12;
  SQObjectPtr *pSVar13;
  SQObjectPtr *pSVar14;
  SQTable *pSVar15;
  long lVar16;
  long *plVar17;
  long lVar18;
  SQInteger SVar19;
  SQInteger SVar20;
  SQInteger SVar21;
  bool bVar22;
  SQExceptionTrap *p;
  SQTable *pSVar23;
  SQUnsignedInteger SVar24;
  char *s;
  ulong uVar25;
  SQUnsignedInteger SVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  
  if (this->_state == eRunning) {
    s = "resuming active generator";
  }
  else {
    if (this->_state != eDead) {
      uVar25 = (long)dest - (long)((v->_stack)._vals + v->_stackbase) >> 4;
      if (0xff < uVar25) {
        __assert_fail("target>=0 && target<=255",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqobject.cpp"
                      ,0xab,"bool SQGenerator::Resume(SQVM *, SQObjectPtr &)");
      }
      SVar8 = (this->_stack)._size;
      lVar27 = v->_top;
      bVar22 = SQVM::EnterFrame(v,lVar27,lVar27 + SVar8,false);
      if (!bVar22) {
        return false;
      }
      pCVar9 = v->ci;
      pCVar9->_generator = this;
      pCVar9->_target = (SQInt32)uVar25;
      SVar3 = (pCVar9->_closure).super_SQObject._type;
      pSVar23 = (pCVar9->_closure).super_SQObject._unVal.pTable;
      pSVar10 = (this->_ci)._closure.super_SQObject._unVal.pTable;
      (pCVar9->_closure).super_SQObject._unVal.pTable = pSVar10;
      SVar4 = (this->_ci)._closure.super_SQObject._type;
      (pCVar9->_closure).super_SQObject._type = SVar4;
      if ((SVar4 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar23->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar23->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
            [2])();
        }
      }
      pCVar9 = v->ci;
      pSVar13 = (this->_ci)._literals;
      pCVar9->_ip = (this->_ci)._ip;
      pCVar9->_literals = pSVar13;
      pCVar9->_ncalls = (this->_ci)._ncalls;
      iVar5 = (this->_ci)._etraps;
      pCVar9->_etraps = iVar5;
      pCVar9->_root = (this->_ci)._root;
      if (0 < iVar5) {
        SVar26 = (this->_etraps)._size;
        p = (v->_etraps)._vals;
        uVar25 = (v->_etraps)._size;
        auVar29._8_4_ = (int)lVar27;
        auVar29._0_8_ = lVar27;
        auVar29._12_4_ = (int)((ulong)lVar27 >> 0x20);
        lVar28 = 0;
        do {
          pSVar11 = (this->_etraps)._vals;
          uVar12 = (v->_etraps)._allocated;
          if (uVar12 <= uVar25) {
            SVar24 = uVar25 * 2;
            if (SVar24 == 0) {
              SVar24 = 4;
            }
            p = (SQExceptionTrap *)sq_vm_realloc(p,uVar12 << 5,SVar24 << 5);
            (v->_etraps)._vals = p;
            (v->_etraps)._allocated = SVar24;
            uVar25 = (v->_etraps)._size;
          }
          (v->_etraps)._size = uVar25 + 1;
          SVar19 = pSVar11[SVar26 - 1]._stackbase;
          SVar20 = pSVar11[SVar26 - 1]._stacksize;
          SVar21 = pSVar11[SVar26 - 1]._extarget;
          p[uVar25]._ip = pSVar11[SVar26 - 1]._ip;
          (&p[uVar25]._ip)[1] = (SQInstruction *)SVar21;
          p[uVar25]._stackbase = SVar19;
          p[uVar25]._stacksize = SVar20;
          SVar26 = (this->_etraps)._size - 1;
          (this->_etraps)._size = SVar26;
          p = (v->_etraps)._vals;
          uVar25 = (v->_etraps)._size;
          lVar16 = p[uVar25 - 1]._stacksize;
          p[uVar25 - 1]._stackbase = p[uVar25 - 1]._stackbase + lVar27;
          p[uVar25 - 1]._stacksize = lVar16 + auVar29._8_8_;
          lVar28 = lVar28 + 1;
        } while (lVar28 < (this->_ci)._etraps);
      }
      pSVar13 = (this->_stack)._vals;
      SVar3 = (pSVar13->super_SQObject)._type;
      pSVar23 = (SQTable *)(pSVar13->super_SQObject)._unVal.pWeakRef;
      pSVar14 = (v->_stack)._vals;
      lVar27 = v->_stackbase;
      pSVar13 = pSVar14 + lVar27;
      pSVar10 = pSVar14[lVar27].super_SQObject._unVal.pTable;
      if (SVar3 == OT_WEAKREF) {
        pSVar15 = (SQTable *)(pSVar23->super_SQDelegable).super_SQCollectable._prev;
        (pSVar13->super_SQObject)._unVal.pTable = pSVar15;
        SVar3 = *(SQObjectType *)&(pSVar23->super_SQDelegable).super_SQCollectable._next;
        pSVar23 = pSVar15;
      }
      else {
        (pSVar13->super_SQObject)._unVal.pWeakRef = (SQWeakRef *)pSVar23;
      }
      SVar4 = pSVar14[lVar27].super_SQObject._type;
      (pSVar13->super_SQObject)._type = SVar3;
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar23->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar4 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
            [2])();
        }
      }
      if (1 < (long)SVar8) {
        lVar27 = SVar8 - 1;
        lVar28 = 0x18;
        do {
          lVar16 = v->_stackbase;
          pSVar13 = (v->_stack)._vals;
          pSVar14 = (this->_stack)._vals;
          uVar6 = *(uint *)((long)pSVar13 + lVar28 + -8 + lVar16 * 0x10);
          plVar17 = *(long **)((long)&pSVar13[lVar16].super_SQObject._type + lVar28);
          lVar18 = *(long *)((long)&(pSVar14->super_SQObject)._type + lVar28);
          *(long *)((long)&pSVar13[lVar16].super_SQObject._type + lVar28) = lVar18;
          uVar7 = *(uint *)((long)pSVar14 + lVar28 + -8);
          *(uint *)((long)pSVar13 + lVar28 + -8 + lVar16 * 0x10) = uVar7;
          if ((uVar7 >> 0x1b & 1) != 0) {
            plVar2 = (long *)(lVar18 + 8);
            *plVar2 = *plVar2 + 1;
          }
          if ((uVar6 >> 0x1b & 1) != 0) {
            plVar2 = plVar17 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar17 + 0x10))();
            }
          }
          pSVar13 = (this->_stack)._vals;
          plVar17 = *(long **)((long)&(pSVar13->super_SQObject)._type + lVar28);
          uVar6 = *(uint *)((long)pSVar13 + lVar28 + -8);
          *(undefined4 *)((long)pSVar13 + lVar28 + -8) = 0x1000001;
          *(undefined8 *)((long)&(pSVar13->super_SQObject)._type + lVar28) = 0;
          if ((uVar6 >> 0x1b & 1) != 0) {
            plVar2 = plVar17 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar17 + 0x10))();
            }
          }
          lVar28 = lVar28 + 0x10;
          lVar27 = lVar27 + -1;
        } while (lVar27 != 0);
      }
      this->_state = eRunning;
      if (v->_debughook == false) {
        return true;
      }
      SQVM::CallDebugHook(v,99,0);
      return true;
    }
    s = "resuming dead generator";
  }
  SQVM::Raise_Error(v,s);
  return false;
}

Assistant:

bool SQGenerator::Resume(SQVM *v,SQObjectPtr &dest)
{
    if(_state==eDead){ v->Raise_Error(_SC("resuming dead generator")); return false; }
    if(_state==eRunning){ v->Raise_Error(_SC("resuming active generator")); return false; }
    SQInteger size = _stack.size();
    SQInteger target = &dest - &(v->_stack._vals[v->_stackbase]);
    assert(target>=0 && target<=255);
    SQInteger newbase = v->_top;
    if(!v->EnterFrame(v->_top, v->_top + size, false))
        return false;
    v->ci->_generator   = this;
    v->ci->_target      = (SQInt32)target;
    v->ci->_closure     = _ci._closure;
    v->ci->_ip          = _ci._ip;
    v->ci->_literals    = _ci._literals;
    v->ci->_ncalls      = _ci._ncalls;
    v->ci->_etraps      = _ci._etraps;
    v->ci->_root        = _ci._root;


    for(SQInteger i=0;i<_ci._etraps;i++) {
        v->_etraps.push_back(_etraps.top());
        _etraps.pop_back();
        SQExceptionTrap &et = v->_etraps.back();
        // restore absolute stack base and size
        et._stackbase += newbase;
        et._stacksize += newbase;
    }
    SQObject _this = _stack._vals[0];
    v->_stack[v->_stackbase] = sq_type(_this) == OT_WEAKREF ? _weakref(_this)->_obj : _this;

    for(SQInteger n = 1; n<size; n++) {
        v->_stack[v->_stackbase+n] = _stack._vals[n];
        _stack._vals[n].Null();
    }

    _state=eRunning;
    if (v->_debughook)
        v->CallDebugHook(_SC('c'));

    return true;
}